

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_ObjMarkTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,Vec_Int_t *vMarked)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  Vec_Int_t *pVVar3;
  int local_30;
  int i;
  int iFanout;
  Vec_Int_t *vMarked_local;
  int nFanMax_local;
  int nTfoLevMax_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar1 == 0) {
    Vec_IntPush(vMarked,iObj);
    iVar1 = Acb_ObjLevelD(p,iObj);
    if ((iVar1 <= nTfoLevMax) && (iVar1 = Acb_ObjFanoutNum(p,iObj), iVar1 <= nFanMax)) {
      local_30 = 0;
      while( true ) {
        pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
        iVar1 = Vec_IntSize(pVVar3);
        if (iVar1 <= local_30) break;
        pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
        iVar1 = Vec_IntEntry(pVVar3,local_30);
        AVar2 = Acb_ObjType(p,iVar1);
        if (AVar2 != ABC_OPER_NONE) {
          Acb_ObjMarkTfo_rec(p,iVar1,nTfoLevMax,nFanMax,vMarked);
        }
        local_30 = local_30 + 1;
      }
    }
  }
  return;
}

Assistant:

void Acb_ObjMarkTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, Vec_Int_t * vMarked )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Vec_IntPush( vMarked, iObj );
    if ( Acb_ObjLevelD(p, iObj) > nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjMarkTfo_rec( p, iFanout, nTfoLevMax, nFanMax, vMarked );
}